

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::FragDepthWriteCase::iterate(FragDepthWriteCase *this)

{
  RenderContext *pRVar1;
  code *pcVar2;
  void *pvVar3;
  FragDepthWriteCase *pFVar4;
  undefined8 uVar5;
  bool bVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  TestError *pTVar12;
  char *description;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float position [16];
  Surface referenceFrame;
  Surface renderedFrame;
  float coord [8];
  ProgramSources sources;
  ShaderProgram program;
  Random rnd;
  undefined1 local_318 [8];
  void *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  int local_2f0;
  FragDepthWriteCase *local_2e8;
  uint local_2e0;
  uint local_2dc;
  undefined1 local_2d8 [8];
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c8;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  float fStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 uStack_2a0;
  undefined1 local_298 [16];
  TestLog *local_280;
  Surface local_278;
  Surface local_260;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  pointer local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  int local_1c0;
  pointer local_1b8;
  pointer pbStack_1b0;
  int local_1a8;
  value_type *local_1a0;
  PrimitiveType local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  pointer pbStack_160;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_158;
  undefined1 local_138 [40];
  ShaderProgram local_110;
  deRandom local_40;
  int *piVar11;
  
  local_298._8_8_ = local_298._0_8_;
  local_280 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_298._0_4_ = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_298._4_4_ = extraout_var;
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar7);
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar11 = (int *)CONCAT44(extraout_var_00,iVar8);
  iVar8 = *piVar11;
  iVar16 = 0x80;
  if (iVar8 < 0x80) {
    iVar16 = iVar8;
  }
  iVar15 = 0x80;
  if (piVar11[1] < 0x80) {
    iVar15 = piVar11[1];
  }
  dVar7 = deRandom_getUint32(&local_40);
  local_2dc = dVar7 % ((iVar8 - iVar16) + 1U);
  iVar8 = piVar11[1];
  dVar7 = deRandom_getUint32(&local_40);
  local_2e0 = dVar7 % ((iVar8 - iVar15) + 1U);
  tcu::Surface::Surface(&local_260,iVar16,iVar15);
  tcu::Surface::Surface(&local_278,iVar16,iVar15);
  if (piVar11[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x136);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar5 = local_298._0_8_;
  (**(code **)(local_298._0_8_ + 0x1a00))(local_2dc,local_2e0,iVar16,iVar15);
  (**(code **)(uVar5 + 0x188))(0x4500);
  (**(code **)(uVar5 + 0x5e0))(0xb71);
  (**(code **)(uVar5 + 0x4a0))(0x201);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2d8 = (undefined1  [8])&aStack_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_318,(this->m_fragSrc)._M_dataplus._M_p,(allocator<char> *)local_248);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1e8,0,0xac);
  local_138._0_8_ = (pointer)0x0;
  local_138[8] = 0;
  local_138._9_7_ = 0;
  local_138[0x10] = 0;
  local_138._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d0,(value_type *)local_318);
  glu::ShaderProgram::ShaderProgram(&local_110,pRVar1,(ProgramSources *)local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_158);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1e8 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  uVar5 = local_298._0_8_;
  if (local_2d8 != (undefined1  [8])&aStack_2c8) {
    operator_delete((void *)local_2d8,
                    CONCAT44(aStack_2c8._M_allocated_capacity._4_4_,
                             aStack_2c8._M_allocated_capacity._0_4_) + 1);
  }
  glu::operator<<(local_280,&local_110);
  if (local_110.m_program.m_info.linkOk == false) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x145);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_238._M_allocated_capacity = 0x3f800000;
  local_238._8_8_ = 0x3f8000003f800000;
  local_248 = (undefined1  [8])0x0;
  uStack_240 = 0x3f80000000000000;
  uStack_2a8 = 0x3f800000;
  uStack_2a4 = 0x3f800000;
  uStack_2a0 = 0x3f800000bf800000;
  local_2b8 = 0x3f800000;
  uStack_2b4 = 0xbf800000;
  fStack_2b0 = 0.0;
  uStack_2ac = 0x3f800000;
  aStack_2c8._M_allocated_capacity._0_4_ = 0xbf800000;
  aStack_2c8._M_allocated_capacity._4_4_ = 0x3f800000;
  aStack_2c8._8_4_ = 0;
  aStack_2c8._12_4_ = 0x3f800000;
  local_2d8 = (undefined1  [8])0xbf800000bf800000;
  uStack_2d0 = 1.0;
  uStack_2cc = 0x3f800000;
  (**(code **)(uVar5 + 0x1680))(local_110.m_program.m_program);
  pcVar2 = *(code **)(local_298._0_8_ + 0x15a0);
  uVar9 = (**(code **)(local_298._0_8_ + 0xb48))(local_110.m_program.m_program,"u_color");
  (*pcVar2)(uVar9);
  deqp::gls::setupDefaultUniforms
            (((this->super_TestCase).m_context)->m_renderCtx,local_110.m_program.m_program);
  local_2e8 = this;
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"a_position","");
  local_318._0_4_ = 1;
  pvVar3 = (void *)((long)&local_308 + 8);
  local_310 = pvVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_208,local_200 + (long)local_208);
  local_2f0 = 0;
  local_1e8._0_4_ = local_318._0_4_;
  local_1e0._M_p = (pointer)&local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_310,(long)local_310 + local_308._M_allocated_capacity);
  local_1c0 = local_2f0;
  local_1b8 = (pointer)0x8;
  pbStack_1b0 = (pointer)0x400000004;
  local_1a8 = 0;
  local_1a0 = (value_type *)local_2d8;
  if (local_310 != pvVar3) {
    operator_delete(local_310,local_308._8_8_ + 1);
  }
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"a_coord","");
  local_318._0_4_ = 1;
  local_310 = pvVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_228,local_220 + (long)local_228);
  local_2f0 = 0;
  local_198 = local_318._0_4_;
  pbVar17 = &local_180;
  local_190[0] = pbVar17;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_190,local_310,(long)local_310 + local_308._M_allocated_capacity);
  local_180.field_2._M_allocated_capacity._0_4_ = local_2f0;
  local_180.field_2._8_8_ = (pointer)0x8;
  pbStack_160 = (pointer)0x400000002;
  local_158.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_158.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_248;
  if (local_310 != pvVar3) {
    operator_delete(local_310,local_308._8_8_ + 1);
  }
  pFVar4 = local_2e8;
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  local_318 = (undefined1  [8])0x600000000;
  local_310 = (void *)CONCAT44(local_310._4_4_,1);
  local_308._M_allocated_capacity = (size_type)iterate::quadIndices;
  glu::draw(((pFVar4->super_TestCase).m_context)->m_renderCtx,local_110.m_program.m_program,2,
            (VertexArrayBinding *)local_1e8,(PrimitiveList *)local_318,(DrawUtilCallback *)0x0);
  lVar14 = -0xa0;
  do {
    if (pbVar17 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        pbVar17[-1].field_2._M_allocated_capacity) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pbVar17[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar17->_M_dataplus)._M_p + 1));
    }
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pbVar17[-3].field_2;
    lVar14 = lVar14 + 0x50;
  } while (lVar14 != 0);
  dVar7 = (**(code **)(local_298._0_8_ + 0x800))();
  glu::checkError(dVar7,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0x166);
  glu::ShaderProgram::~ShaderProgram(&local_110);
  pRVar1 = ((pFVar4->super_TestCase).m_context)->m_renderCtx;
  local_2d8 = (undefined1  [8])&aStack_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  local_318 = (undefined1  [8])&local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,
             "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = u_color;\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1e8,0,0xac);
  local_138._0_8_ = (pointer)0x0;
  local_138[8] = 0;
  local_138._9_7_ = 0;
  local_138[0x10] = 0;
  local_138._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d0,(value_type *)local_318);
  glu::ShaderProgram::ShaderProgram(&local_110,pRVar1,(ProgramSources *)local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_158);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1e8 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  uVar5 = local_298._0_8_;
  if (local_2d8 != (undefined1  [8])&aStack_2c8) {
    operator_delete((void *)local_2d8,
                    CONCAT44(aStack_2c8._M_allocated_capacity._4_4_,
                             aStack_2c8._M_allocated_capacity._0_4_) + 1);
  }
  if (local_110.m_program.m_info.linkOk == false) {
    glu::operator<<(local_280,&local_110);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x16f);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar8 = (**(code **)(uVar5 + 0x780))(local_110.m_program.m_program,"a_position");
  uVar9 = (**(code **)(uVar5 + 0xb48))(local_110.m_program.m_program,"u_color");
  (**(code **)(uVar5 + 0x1680))(local_110.m_program.m_program);
  (**(code **)(uVar5 + 0x4a8))(0);
  iVar16 = 0;
  do {
    local_248._4_4_ = (float)iVar16 * 0.06666667;
    local_248._0_4_ = local_248._4_4_;
    uStack_2d0 = (float)local_248._4_4_ + (float)local_248._4_4_ + -1.0;
    uStack_240 = CONCAT44(0x3f800000,local_248._4_4_);
    local_2d8 = (undefined1  [8])0xbf800000bf800000;
    uStack_2cc = 0x3f800000;
    aStack_2c8._M_allocated_capacity._0_4_ = 0xbf800000;
    aStack_2c8._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_2c8._12_4_ = 0x3f800000;
    local_2b8 = 0x3f800000;
    uStack_2b4 = 0xbf800000;
    uStack_2ac = 0x3f800000;
    uStack_2a8 = 0x3f800000;
    uStack_2a4 = 0x3f800000;
    uStack_2a0 = CONCAT44(0x3f800000,uStack_2d0);
    local_1e8 = (undefined1  [8])((ulong)local_1e8 & 0xffffffff00000000);
    local_1e0._M_p = (pointer)&local_1d0;
    local_1d8 = (pointer)0x0;
    local_1d0._M_local_buf[0] = '\0';
    local_1b8 = (pointer)0x8;
    pbStack_1b0 = (pointer)0x400000004;
    local_1a8 = 0;
    local_1a0 = (value_type *)local_2d8;
    aStack_2c8._8_4_ = uStack_2d0;
    fStack_2b0 = uStack_2d0;
    local_1c0 = iVar8;
    (**(code **)(uVar5 + 0x15a8))(uVar9,1,local_248);
    local_318 = (undefined1  [8])0x600000000;
    local_310 = (void *)CONCAT44(local_310._4_4_,1);
    local_308._M_allocated_capacity = (size_type)iterate::quadIndices;
    glu::draw(((local_2e8->super_TestCase).m_context)->m_renderCtx,local_110.m_program.m_program,1,
              (VertexArrayBinding *)local_1e8,(PrimitiveList *)local_318,(DrawUtilCallback *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,
                      CONCAT71(local_1d0._M_allocated_capacity._1_7_,local_1d0._M_local_buf[0]) + 1)
      ;
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != 0x10);
  dVar7 = (**(code **)(uVar5 + 0x800))();
  glu::checkError(dVar7,"Visualization draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0x18c);
  glu::ShaderProgram::~ShaderProgram(&local_110);
  pRVar1 = ((local_2e8->super_TestCase).m_context)->m_renderCtx;
  local_1e8._0_4_ = RGBA;
  local_1e8._4_4_ = UNORM_INT8;
  if ((void *)local_260.m_pixels.m_cap != (void *)0x0) {
    local_260.m_pixels.m_cap = (size_t)local_260.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_110,(TextureFormat *)local_1e8,local_260.m_width,
             local_260.m_height,1,(void *)local_260.m_pixels.m_cap);
  glu::readPixels(pRVar1,local_2dc,local_2e0,(PixelBufferAccess *)&local_110);
  if (0 < local_278.m_height) {
    iVar15 = 0;
    iVar8 = local_278.m_height;
    iVar16 = local_278.m_width;
    do {
      if (0 < iVar16) {
        local_298 = ZEXT416((uint)((float)iVar15 + 0.5));
        iVar13 = 0;
        do {
          auVar19._0_4_ = (float)iVar13 + 0.5;
          auVar19._4_4_ = local_298._0_4_;
          auVar19._8_4_ = 0;
          auVar19._12_4_ = local_298._4_4_;
          auVar20._0_4_ = (float)iVar16;
          auVar20._4_4_ = (float)local_278.m_height;
          auVar20._8_8_ = 0;
          auVar19 = divps(auVar19,auVar20);
          local_110.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start = auVar19._0_8_;
          fVar18 = (*local_2e8->m_evalFunc)((Vec2 *)&local_110);
          fVar18 = floorf(fVar18 / 0.06666667);
          fVar18 = (float)(int)fVar18 * 0.06666667 * 255.0;
          uVar10 = (uint)(fVar18 + *(float *)(&DAT_00b21f3c + (ulong)(fVar18 < 0.0) * 4));
          if (0xfe < (int)uVar10) {
            uVar10 = 0xff;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          *(uint *)((long)local_278.m_pixels.m_ptr + (long)(local_278.m_width * iVar15 + iVar13) * 4
                   ) = uVar10 << 0x10 | uVar10 << 8 | uVar10 | 0xff000000;
          iVar13 = iVar13 + 1;
          iVar8 = local_278.m_height;
          iVar16 = local_278.m_width;
        } while (iVar13 < local_278.m_width);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < iVar8);
  }
  bVar6 = tcu::fuzzyCompare(local_280,"Result","Image comparison result",&local_278,&local_260,0.05,
                            COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar6) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((local_2e8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar6,
             description);
  tcu::Surface::~Surface(&local_278);
  tcu::Surface::~Surface(&local_260);
  return STOP;
}

Assistant:

FragDepthWriteCase::IterateResult FragDepthWriteCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	int							viewportW		= de::min(128, renderTarget.getWidth());
	int							viewportH		= de::min(128, renderTarget.getHeight());
	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const int					numDepthSteps	= 16;
	const float					depthStep		= 1.0f/(float)(numDepthSteps-1);

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_LESS);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Render with given shader.
	{
		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, m_fragSrc.c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f
		};
		const float position[] =
		{
			-1.0f, -1.0f, +1.0f, 1.0f,
			-1.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(program.getProgram());
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::va::Float("a_position",	4, 4, 0, &position[0]),
				glu::va::Float("a_coord",		2, 4, 0, &coord[0])
			};
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	// Visualize by rendering full-screen quads with increasing depth and color.
	{
		glu::ShaderProgram program (m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_defaultFragmentShaderSrc));
		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Compile failed");
		}

		int posLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		int colorLoc	= gl.getUniformLocation(program.getProgram(), "u_color");

		gl.useProgram(program.getProgram());
		gl.depthMask(GL_FALSE);

		for (int stepNdx = 0; stepNdx < numDepthSteps; stepNdx++)
		{
			float	f		= (float)stepNdx*depthStep;
			float	depth	= f*2.0f - 1.0f;
			Vec4	color	= Vec4(f, f, f, 1.0f);

			const float position[] =
			{
				-1.0f, -1.0f, depth, 1.0f,
				-1.0f, +1.0f, depth, 1.0f,
				+1.0f, -1.0f, depth, 1.0f,
				+1.0f, +1.0f, depth, 1.0f
			};
			glu::VertexArrayBinding	posBinding = glu::va::Float(posLoc, 4, 4, 0, &position[0]);

			gl.uniform4fv(colorLoc, 1, color.getPtr());
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Visualization draw");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		for (int x = 0; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
			float	d		= m_evalFunc(Vec2(xf, yf));
			int		step	= (int)deFloatFloor(d / depthStep);
			int		col		= de::clamp(deRoundFloatToInt32((float)step*depthStep*255.0f), 0, 255);

			referenceFrame.setPixel(x, y, tcu::RGBA(col, col, col, 0xff));
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}